

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLXSIDEGAP3METHODS_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000048;
  double *in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000060;
  int in_stack_0000006c;
  int in_stack_00000070;
  int *in_stack_00000080;
  int *in_stack_00000088;
  int *in_stack_00000090;
  
  TVar1 = TA_CDLXSIDEGAP3METHODS
                    (in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058,
                     in_stack_00000050,in_stack_00000048,in_stack_00000080,in_stack_00000088,
                     in_stack_00000090);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLXSIDEGAP3METHODS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLXSIDEGAP3METHODS(
/* Generated */                             startIdx,
/* Generated */                             endIdx,
/* Generated */                             params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                             params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                             params->in[0].data.inPrice.low, /* inLow */
/* Generated */                             params->in[0].data.inPrice.close, /* inClose */
/* Generated */                             outBegIdx, 
/* Generated */                             outNBElement, 
/* Generated */                             params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }